

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcAnalyzerResults.cpp
# Opt level: O1

void __thiscall
HdlcAnalyzerResults::GenerateExportFile
          (HdlcAnalyzerResults *this,char *file,DisplayBase display_base,U32 param_3)

{
  _Alloc_hider _Var1;
  long lVar2;
  char cVar3;
  HdlcFrameType HVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  ostream *poVar8;
  long lVar9;
  undefined8 uVar10;
  undefined4 extraout_var;
  uint uVar11;
  ulong uVar12;
  string *unaff_R13;
  Frame fcsFrame;
  string sep_1;
  string sep;
  Frame firstAddressFrame;
  char escapeStr [5];
  ofstream fileStream;
  char addressStr [64];
  char timeStr [64];
  undefined1 auStack_3d8 [4];
  uint local_3d4;
  DisplayBase local_3d0;
  undefined4 local_3cc;
  string local_3c8;
  undefined2 local_3a8;
  string local_3a0;
  undefined2 local_380;
  string local_378;
  ulong local_358;
  uint local_350;
  uint local_34c;
  ulonglong local_348;
  undefined8 uStack_340;
  ulonglong local_338;
  undefined8 uStack_330;
  undefined2 local_328;
  ulonglong local_318;
  long local_310;
  long local_308;
  char local_2fd [5];
  long local_2f8;
  filebuf local_2f0 [240];
  ios_base local_200 [264];
  ulonglong local_f8;
  undefined8 uStack_f0;
  ulonglong local_e8;
  undefined8 uStack_e0;
  undefined2 local_d8;
  char local_78 [72];
  
  local_3d0 = display_base;
  std::ofstream::ofstream(&local_2f8,file,_S_out);
  local_318 = Analyzer::GetTriggerSample();
  local_34c = Analyzer::GetSampleRate();
  uVar6 = (ulong)this->mSettings->mHdlcFcs;
  uVar11 = 0;
  if (uVar6 < 3) {
    uVar11 = *(uint *)(&DAT_0010f108 + uVar6 * 4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2f8,"Time[s],Address,Control,Information,FCS",0x27);
  std::ios::widen((char)(ostream *)&local_2f8 + (char)*(undefined8 *)(local_2f8 + -0x18));
  std::ostream::put((char)&local_2f8);
  std::ostream::flush();
  AnalyzerHelpers::GetNumberString(0x7d,local_3d0,8,local_2fd,5);
  uVar6 = AnalyzerResults::GetNumFrames();
  switch(this->mSettings->mHdlcControl) {
  case HDLC_BASIC_CONTROL_FIELD:
    uVar5 = 1;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
    uVar5 = 2;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
    uVar5 = 4;
    break;
  case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
    uVar5 = 8;
    break;
  default:
    local_3cc = 0;
    uVar5 = 0;
    goto LAB_0010ba92;
  }
  local_3cc = 0x10f001;
LAB_0010ba92:
  if (uVar6 != 0) {
    local_310 = (ulong)uVar5 + (ulong)((ulong)uVar5 == 0);
    uVar12 = 0;
    local_350 = uVar11;
LAB_0010babe:
    Frame::Frame((Frame *)&local_348);
    do {
      AnalyzerResults::GetFrame((ulonglong)&local_f8);
      local_328 = local_d8;
      local_338 = local_e8;
      uStack_330 = uStack_e0;
      local_348 = local_f8;
      uStack_340 = uStack_f0;
      Frame::~Frame((Frame *)&local_f8);
      if ((byte)((char)local_328 - 1U) < 2) {
        AnalyzerHelpers::GetTimeString(local_348,local_318,local_34c,local_78,0x40);
        sVar7 = strlen(local_78);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,local_78,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
        if (this->mSettings->mHdlcAddr != HDLC_BASIC_ADDRESS_FIELD) {
          Frame::Frame((Frame *)&local_3c8,(Frame *)&local_348);
          goto LAB_0010bbc5;
        }
        AnalyzerResults::GetFrame((ulonglong)&local_f8);
        local_328 = local_d8;
        local_338 = local_e8;
        uStack_330 = uStack_e0;
        local_348 = local_f8;
        uStack_340 = uStack_f0;
        Frame::~Frame((Frame *)&local_f8);
        if ((char)local_328 != '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          cVar3 = '\x05';
          std::ostream::flush();
          goto LAB_0010c4c4;
        }
        AnalyzerHelpers::GetNumberString(local_338,local_3d0,8,(char *)&local_f8,0x40);
        EscapeByteStr_abi_cxx11_(&local_3c8,this,(Frame *)&local_348);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_2f8,local_3c8._M_dataplus._M_p,
                            local_3c8._M_string_length);
        sVar7 = strlen((char *)&local_f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_f8,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,",",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
          operator_delete(local_3c8._M_dataplus._M_p);
        }
        unaff_R13 = (string *)0x0;
        goto LAB_0010bf6b;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < uVar6);
    cVar3 = '\x01';
    AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
    goto LAB_0010c4c4;
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,0);
LAB_0010c586:
  local_2f8 = _VTT;
  *(undefined8 *)(local_2f0 + *(long *)(_VTT + -0x18) + -8) = _GetInteger;
  std::filebuf::~filebuf(local_2f0);
  std::ios_base::~ios_base(local_200);
  return;
  while( true ) {
    AnalyzerHelpers::GetNumberString
              (local_3c8.field_2._M_allocated_capacity,local_3d0,8,(char *)&local_f8,0x40);
    if ((uVar10 & 1) == 0 && local_3c8.field_2._8_8_ == 0) {
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      local_378._M_string_length = 0;
      local_378.field_2._M_local_buf[0] = '\0';
    }
    else {
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378," ","");
    }
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_2f8,local_378._M_dataplus._M_p,local_378._M_string_length)
    ;
    EscapeByteStr_abi_cxx11_(&local_3a0,this,(Frame *)&local_3c8);
    unaff_R13 = (string *)
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar8,local_3a0._M_dataplus._M_p,local_3a0._M_string_length);
    sVar7 = strlen((char *)&local_f8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)unaff_R13,(char *)&local_f8,sVar7)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
      operator_delete(local_3a0._M_dataplus._M_p);
    }
    if ((uVar10 & 1) == 0) {
      cVar3 = '\b';
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
    }
    else {
      uVar12 = uVar12 + 1;
      if (uVar12 < uVar6) {
        AnalyzerResults::GetFrame((ulonglong)&local_3a0);
        local_3a8 = local_380;
        local_3c8.field_2._M_allocated_capacity =
             CONCAT71(local_3a0.field_2._M_allocated_capacity._1_7_,
                      local_3a0.field_2._M_local_buf[0]);
        local_3c8.field_2._8_8_ = local_3a0.field_2._8_8_;
        local_3c8._M_dataplus._M_p = local_3a0._M_dataplus._M_p;
        local_3c8._M_string_length = local_3a0._M_string_length;
        Frame::~Frame((Frame *)&local_3a0);
        cVar3 = '\0';
      }
      else {
        cVar3 = '\x01';
        AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p);
    }
    if (cVar3 != '\0') break;
LAB_0010bbc5:
    uVar10 = local_3c8.field_2._M_allocated_capacity;
    if ((char)local_3a8 != '\x02') {
      if ((char)local_3a8 == '\a') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
        std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
        std::ostream::put((char)&local_2f8);
        std::ostream::flush();
        unaff_R13 = (string *)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
        cVar3 = '\0';
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
        std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
        std::ostream::put((char)&local_2f8);
        cVar3 = '\0';
        std::ostream::flush();
        unaff_R13 = (string *)0x0;
      }
      goto LAB_0010bf58;
    }
  }
  if (cVar3 == '\b') {
    cVar3 = '\0';
  }
  unaff_R13 = (string *)0x0;
LAB_0010bf58:
  Frame::~Frame((Frame *)&local_3c8);
  if (cVar3 != '\0') goto LAB_0010c4c4;
LAB_0010bf6b:
  if ((char)unaff_R13 == '\0') {
    cVar3 = '\n';
    if ((char)local_3cc != '\0') {
      local_3d4 = (uint)unaff_R13;
      local_308 = uVar12 + 1;
      local_358 = 0;
      lVar2 = 0;
      do {
        lVar9 = lVar2;
        if (uVar6 <= (ulong)(local_308 + lVar9)) {
          uVar12 = uVar12 + lVar9 + 1;
          cVar3 = '\x01';
          AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
          unaff_R13 = (string *)(ulong)local_3d4;
          goto LAB_0010c261;
        }
        AnalyzerResults::GetFrame((ulonglong)&local_3c8);
        if ((char)local_3a8 == '\a') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          uVar10 = std::ostream::flush();
          local_3d4 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
          cVar3 = '\n';
        }
        else if ((byte)((char)local_3a8 - 3U) < 2) {
          if ((int)lVar9 == 0) {
            HVar4 = HdlcAnalyzer::GetFrameType(local_3c8.field_2._M_local_buf[0]);
            local_358 = CONCAT71((int7)(CONCAT44(extraout_var,HVar4) >> 8),HVar4 == HDLC_U_FRAME);
          }
          AnalyzerHelpers::GetNumberString
                    (local_3c8.field_2._M_allocated_capacity,local_3d0,8,(char *)&local_f8,0x40);
          if (((local_358 & 1) == 0) && (this->mSettings->mHdlcControl != HDLC_BASIC_CONTROL_FIELD))
          {
            local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a0," ","");
          }
          else {
            local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
            local_3a0._M_string_length = 0;
            local_3a0.field_2._M_local_buf[0] = '\0';
          }
          _Var1._M_p = local_3a0._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)auStack_3d8 + (int)*(undefined8 *)(local_2f8 + -0x18) + 0xe0);
          }
          else {
            sVar7 = strlen(local_3a0._M_dataplus._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_2f8,_Var1._M_p,sVar7);
          }
          EscapeByteStr_abi_cxx11_(&local_378,this,(Frame *)&local_3c8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_2f8,local_378._M_dataplus._M_p,
                              local_378._M_string_length);
          sVar7 = strlen((char *)&local_f8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_f8,sVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != &local_378.field_2) {
            operator_delete(local_378._M_dataplus._M_p);
          }
          cVar3 = '\0';
          if ((local_358 & 1) != 0) {
            cVar3 = '\n';
          }
          if ((int)lVar9 != 0) {
            cVar3 = '\0';
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p);
          }
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          cVar3 = '\f';
          std::ostream::flush();
        }
        Frame::~Frame((Frame *)&local_3c8);
        if ((cVar3 != '\f') && (cVar3 != '\0')) goto LAB_0010c235;
        lVar2 = lVar9 + 1;
      } while ((int)local_310 != (int)(lVar9 + 1));
      cVar3 = '\n';
LAB_0010c235:
      uVar12 = uVar12 + lVar9 + 1;
      unaff_R13 = (string *)(ulong)local_3d4;
    }
LAB_0010c261:
    if (cVar3 != '\n') goto LAB_0010c4c4;
    if (((ulong)unaff_R13 & 1) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
      uVar12 = uVar12 + 1;
      if (uVar6 <= uVar12) {
        cVar3 = '\x01';
        AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
        goto LAB_0010c4c4;
      }
      local_3d4 = (uint)unaff_R13;
      do {
        AnalyzerResults::GetFrame((ulonglong)&local_3c8);
        if ((char)local_3a8 == '\x05') {
          AnalyzerHelpers::GetNumberString
                    (local_3c8.field_2._M_allocated_capacity,local_3d0,8,(char *)&local_f8,0x40);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8," ",1);
          EscapeByteStr_abi_cxx11_(&local_3a0,this,(Frame *)&local_3c8);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&local_2f8,local_3a0._M_dataplus._M_p,
                              local_3a0._M_string_length);
          sVar7 = strlen((char *)&local_f8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_f8,sVar7);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
            operator_delete(local_3a0._M_dataplus._M_p);
          }
          uVar12 = uVar12 + 1;
          cVar3 = '\0';
          if (uVar6 <= uVar12) {
            cVar3 = '\x01';
            AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
          }
        }
        else if ((char)local_3a8 == '\a') {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          uVar10 = std::ostream::flush();
          local_3d4 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
          cVar3 = '\r';
        }
        else {
          cVar3 = '\r';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
        }
        unaff_R13 = &local_3c8;
        Frame::~Frame((Frame *)unaff_R13);
      } while (cVar3 == '\0');
      if (cVar3 != '\r') goto LAB_0010c4c4;
      if ((local_3d4 & 1) == 0) {
        AnalyzerResults::GetFrame((ulonglong)&local_3c8);
        if ((char)local_3a8 == '\x06') {
          AnalyzerHelpers::GetNumberString
                    (local_3c8.field_2._M_allocated_capacity,local_3d0,local_350,(char *)&local_f8,
                     0x80);
          sVar7 = strlen((char *)&local_f8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_2f8,(char *)&local_f8,sVar7);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          std::ostream::flush();
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2f8,",",1);
          std::ios::widen((char)*(undefined8 *)(local_2f8 + -0x18) + (char)&local_2f8);
          std::ostream::put((char)&local_2f8);
          std::ostream::flush();
        }
        uVar12 = uVar12 + 1;
        if (uVar12 < uVar6) {
          cVar3 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
        }
        else {
          cVar3 = '\x01';
          AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar12);
        }
        Frame::~Frame((Frame *)&local_3c8);
        goto LAB_0010c4c4;
      }
    }
  }
  cVar3 = '\x05';
LAB_0010c4c4:
  Frame::~Frame((Frame *)&local_348);
  if ((cVar3 == '\0') || (cVar3 == '\x05')) goto LAB_0010babe;
  goto LAB_0010c586;
}

Assistant:

void HdlcAnalyzerResults::GenerateExportFile( const char* file, DisplayBase display_base, U32 /*export_type_user_id*/ )
{
    ofstream fileStream( file, ios::out );

    U64 triggerSample = mAnalyzer->GetTriggerSample();
    U32 sampleRate = mAnalyzer->GetSampleRate();

    const char* sepChar = " ";

    U8 fcsBits = 0;
    switch( mSettings->mHdlcFcs )
    {
    case HDLC_CRC8:
        fcsBits = 8;
        break;
    case HDLC_CRC16:
        fcsBits = 16;
        break;
    case HDLC_CRC32:
        fcsBits = 32;
        break;
    }

    fileStream << "Time[s],Address,Control,Information,FCS" << endl;

    char escapeStr[ 5 ];
    AnalyzerHelpers::GetNumberString( HDLC_ESCAPE_SEQ_VALUE, display_base, 8, escapeStr, 5 );

    U64 numFrames = GetNumFrames();
    U64 frameNumber = 0;

    U32 numberOfControlBytes = 0;
    switch( mSettings->mHdlcControl )
    {
    case HDLC_BASIC_CONTROL_FIELD:
        numberOfControlBytes = 1;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_128:
        numberOfControlBytes = 2;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_32768:
        numberOfControlBytes = 4;
        break;
    case HDLC_EXTENDED_CONTROL_FIELD_MOD_2147483648:
        numberOfControlBytes = 8;
        break;
    }

    if( numFrames == 0 )
    {
        UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
        return;
    }

    for( ;; )
    {
        bool doAbortFrame = false;
        // Re-sync to start reading HDLC frames from the Address Byte
        Frame firstAddressFrame;
        for( ;; )
        {
            firstAddressFrame = GetFrame( frameNumber );

            // Check for abort
            if( firstAddressFrame.mType == HDLC_FIELD_BASIC_ADDRESS ||
                firstAddressFrame.mType == HDLC_FIELD_EXTENDED_ADDRESS ) // It's and address frame
            {
                break;
            }
            else
            {
                frameNumber++;
                if( frameNumber >= numFrames )
                {
                    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                    return;
                }
            }
        }

        // 1)  Time [s]
        char timeStr[ 64 ];
        AnalyzerHelpers::GetTimeString( firstAddressFrame.mStartingSampleInclusive, triggerSample, sampleRate, timeStr, 64 );
        fileStream << timeStr << ",";

        // 2) Address Field
        if( mSettings->mHdlcAddr == HDLC_BASIC_ADDRESS_FIELD )
        {
            firstAddressFrame = GetFrame( frameNumber );
            if( firstAddressFrame.mType != HDLC_FIELD_BASIC_ADDRESS )
            {
                fileStream << "," << endl;
                continue;
            }

            char addressStr[ 64 ];
            AnalyzerHelpers::GetNumberString( firstAddressFrame.mData1, display_base, 8, addressStr, 64 );
            fileStream << EscapeByteStr( firstAddressFrame ) << addressStr << ",";
        }
        else // Check for extended address
        {
            Frame nextAddress = firstAddressFrame;
            for( ;; )
            {
                // Check for abort
                if( nextAddress.mType == HDLC_ABORT_SEQ )
                {
                    fileStream << "," << endl;
                    doAbortFrame = true;
                    break;
                }

                if( nextAddress.mType != HDLC_FIELD_EXTENDED_ADDRESS ) // ERROR
                {
                    fileStream << "," << endl;
                    break;
                }

                bool endOfAddress = ( ( nextAddress.mData1 & 0x01 ) == 0 );

                char addressStr[ 64 ];
                AnalyzerHelpers::GetNumberString( nextAddress.mData1, display_base, 8, addressStr, 64 );
                string sep = ( endOfAddress && nextAddress.mData2 == 0 ) ? string() : string( sepChar );
                fileStream << sep << EscapeByteStr( nextAddress ) << addressStr;

                if( endOfAddress ) // no more bytes of address?
                {
                    fileStream << ",";
                    break;
                }
                else
                {
                    frameNumber++;
                    if( frameNumber >= numFrames )
                    {
                        UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                        return;
                    }
                    nextAddress = GetFrame( frameNumber );
                }
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        // 3) Control Field
        bool isUFrame = false;
        for( U32 i = 0; i < numberOfControlBytes; ++i )
        {
            frameNumber++;
            if( frameNumber >= numFrames )
            {
                UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                return;
            }

            Frame controlFrame = GetFrame( frameNumber );

            // Check for abort
            if( controlFrame.mType == HDLC_ABORT_SEQ )
            {
                doAbortFrame = true;
                fileStream << "," << endl;
                break;
            }

            if( !( controlFrame.mType == HDLC_FIELD_BASIC_CONTROL || controlFrame.mType == HDLC_FIELD_EXTENDED_CONTROL ) ) // ERROR
            {
                fileStream << "," << endl;
                continue;
            }

            if( i == 0 )
            {
                isUFrame = HdlcAnalyzer::GetFrameType( controlFrame.mData1 ) == HDLC_U_FRAME;
            }

            char controlStr[ 64 ];
            AnalyzerHelpers::GetNumberString( controlFrame.mData1, display_base, 8, controlStr, 64 );
            string sep = ( isUFrame || mSettings->mHdlcControl == HDLC_BASIC_CONTROL_FIELD ) ? string() : string( sepChar );
            fileStream << sep.c_str() << EscapeByteStr( controlFrame ) << controlStr;

            if( i == 0 && isUFrame )
            {
                break;
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        fileStream << ",";

        frameNumber++;
        if( frameNumber >= numFrames )
        {
            UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
            return;
        }

        // 5) Information Fields
        for( ;; )
        {
            Frame infoFrame = GetFrame( frameNumber );

            // Check for abort
            if( infoFrame.mType == HDLC_ABORT_SEQ )
            {
                doAbortFrame = true;
                fileStream << "," << endl;
                break;
            }

            // Check for flag
            if( infoFrame.mType == HDLC_FIELD_FLAG )
            {
                fileStream << ",";
                break;
            }

            // Check for info byte
            if( infoFrame.mType == HDLC_FIELD_INFORMATION ) // ERROR
            {
                char infoByteStr[ 64 ];
                AnalyzerHelpers::GetNumberString( infoFrame.mData1, display_base, 8, infoByteStr, 64 );
                fileStream << sepChar << EscapeByteStr( infoFrame ) << infoByteStr;
                frameNumber++;
                if( frameNumber >= numFrames )
                {
                    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
                    return;
                }
            }
            else
            {
                fileStream << ",";
                break;
            }
        }

        if( doAbortFrame )
        {
            continue;
        }

        // 6) FCS Field
        Frame fcsFrame = GetFrame( frameNumber );
        if( fcsFrame.mType != HDLC_FIELD_FCS )
        {
            fileStream << "," << endl;
        }
        else // HDLC_FIELD_FCS Frame
        {
            char fcsStr[ 128 ];
            AnalyzerHelpers::GetNumberString( fcsFrame.mData1, display_base, fcsBits, fcsStr, 128 );
            fileStream << fcsStr << endl;
        }

        frameNumber++;
        if( frameNumber >= numFrames )
        {
            UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
            return;
        }

        if( UpdateExportProgressAndCheckForCancel( frameNumber, numFrames ) )
        {
            return;
        }
    }

    UpdateExportProgressAndCheckForCancel( frameNumber, numFrames );
}